

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
TempBanGameCommand::trigger
          (TempBanGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  long lVar1;
  PlayerInfo *pPVar2;
  char *pcVar3;
  basic_string_view<char,_std::char_traits<char>_> *pbVar4;
  basic_string_view<char,_std::char_traits<char>_> *args_2;
  char *pcVar5;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> dVar6;
  undefined8 uStackY_d0;
  rep local_b8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  split_parameters;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_70._M_string_length = (size_type)parameters._M_str;
  local_70._M_dataplus._M_p = (pointer)parameters._M_len;
  local_80._M_len = 2;
  local_80._M_str = " \t";
  jessilib::
  word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            (&split_parameters,(basic_string_view<char,_std::char_traits<char>_> *)&local_70,
             &local_80);
  lVar1 = CONCAT44(split_parameters.first._M_len._4_4_,(undefined4)split_parameters.first._M_len);
  if (lVar1 == 0) {
    pcVar3 = "Error: Too few parameters. Syntax: tban [Duration] <player> [Reason]";
    uStackY_d0 = 0x44;
    goto LAB_00133e59;
  }
  pcVar3 = (char *)CONCAT44(split_parameters.first._M_str._4_4_,split_parameters.first._M_str._0_4_)
  ;
  pbVar4 = (basic_string_view<char,_std::char_traits<char>_> *)
           CONCAT44(split_parameters.second._M_len._4_4_,(undefined4)split_parameters.second._M_len)
  ;
  local_b8 = pluginInstance.m_defaultTempBanTime.__r;
  pcVar5 = (char *)CONCAT44(split_parameters.second._M_str._4_4_,
                            split_parameters.second._M_str._0_4_);
  pPVar2 = (PlayerInfo *)RenX::Server::getPlayerByPartName(source,lVar1,pcVar3);
  if (pPVar2 == (PlayerInfo *)0x0) {
    if (CONCAT44(split_parameters.second._M_len._4_4_,(undefined4)split_parameters.second._M_len) !=
        0) {
      dVar6 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (pcVar3,pcVar3 + lVar1);
      local_b8 = (rep)dVar6.duration.__r;
      if (0 < local_b8) {
        if (pluginInstance.m_maxTempBanTime.__r < local_b8) {
          local_b8 = pluginInstance.m_maxTempBanTime.__r;
        }
        local_80._M_len = 2;
        local_80._M_str = " \t";
        jessilib::
        word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                  ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *)&local_70,&split_parameters.second,&local_80);
        split_parameters.first._M_len._0_4_ = local_70._M_dataplus._M_p._0_4_;
        split_parameters.first._M_len._4_4_ = local_70._M_dataplus._M_p._4_4_;
        split_parameters.first._M_str._0_4_ = (undefined4)local_70._M_string_length;
        split_parameters.first._M_str._4_4_ = local_70._M_string_length._4_4_;
        split_parameters.second._M_len._0_4_ = local_70.field_2._M_allocated_capacity._0_4_;
        split_parameters.second._M_len._4_4_ = local_70.field_2._M_allocated_capacity._4_4_;
        split_parameters.second._M_str._0_4_ = local_70.field_2._8_4_;
        split_parameters.second._M_str._4_4_ = local_70.field_2._12_4_;
        pbVar4 = (basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                          local_70.field_2._M_allocated_capacity._0_4_);
        pcVar5 = (char *)CONCAT44(local_70.field_2._12_4_,local_70.field_2._8_4_);
        pPVar2 = (PlayerInfo *)
                 RenX::Server::getPlayerByPartName
                           (source,local_70._M_dataplus._M_p,local_70._M_string_length);
        goto LAB_00133de4;
      }
    }
    pPVar2 = (PlayerInfo *)0x0;
  }
LAB_00133de4:
  pcVar3 = "No reason";
  if (pbVar4 != (basic_string_view<char,_std::char_traits<char>_> *)0x0) {
    pcVar3 = pcVar5;
  }
  args_2 = (basic_string_view<char,_std::char_traits<char>_> *)0x9;
  if (pbVar4 != (basic_string_view<char,_std::char_traits<char>_> *)0x0) {
    args_2 = pbVar4;
  }
  if (pPVar2 == (PlayerInfo *)0x0) {
    pcVar3 = "Error: Player not found.";
    uStackY_d0 = 0x18;
  }
  else if (pPVar2 == player) {
    pcVar3 = "Error: You can\'t ban yourself.";
    uStackY_d0 = 0x1e;
  }
  else {
    if (player->access <= pPVar2->access) {
      local_80._M_len = 0x22;
      local_80._M_str = "Error: You can\'t ban higher level ";
      local_40._M_len = pluginInstance.m_staffTitle._M_string_length;
      local_40._M_str = pluginInstance.m_staffTitle._M_dataplus._M_p;
      local_50._M_len = 2;
      local_50._M_str = "s.";
      jessilib::
      join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                (&local_70,(jessilib *)&local_80,&local_40,&local_50,args_2);
      RenX::Server::sendMessage(source,player,local_70._M_string_length,local_70._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_70);
      return;
    }
    RenX::Server::banPlayer
              (source,pPVar2,(player->name)._M_string_length,(player->name)._M_dataplus._M_p,args_2,
               pcVar3,local_b8);
    pcVar3 = "Player has been temporarily banned and kicked from the game.";
    uStackY_d0 = 0x3c;
  }
LAB_00133e59:
  RenX::Server::sendMessage(source,player,uStackY_d0,pcVar3);
  return;
}

Assistant:

void TempBanGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	auto split_parameters = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (!split_parameters.first.empty()) {
		std::string_view name = split_parameters.first;
		std::chrono::seconds duration = pluginInstance.getDefaultTBanTime();
		std::string_view reason = split_parameters.second;

		RenX::PlayerInfo *target = source->getPlayerByPartName(name);
		if (target == nullptr
			&& !split_parameters.second.empty()) {
			// Try reading first token as duration
			duration = jessilib::duration_from_string(name.data(), name.data() + name.size()).duration;
			if (duration.count() > 0) {
				duration = std::min(duration, pluginInstance.getMaxTBanTime());
				split_parameters = jessilib::word_split_once_view(split_parameters.second, WHITESPACE_SV);
				name = split_parameters.first;
				reason = split_parameters.second;
				target = source->getPlayerByPartName(name);
			}
		}

		if (reason.empty()) {
			reason = "No reason"sv;
		}

		if (target == nullptr)
			source->sendMessage(*player, "Error: Player not found."sv);
		else if (player == target)
			source->sendMessage(*player, "Error: You can't ban yourself."sv);
		else if (target->access >= player->access)
			source->sendMessage(*player, jessilib::join<std::string>("Error: You can't ban higher level "sv, pluginInstance.getStaffTitle(), "s."sv));
		else
		{
			source->banPlayer(*target, player->name, reason, duration);
			source->sendMessage(*player, "Player has been temporarily banned and kicked from the game."sv);
		}
	}
	else
		source->sendMessage(*player, "Error: Too few parameters. Syntax: tban [Duration] <player> [Reason]"sv);
}